

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O1

bool __thiscall SampleInstance::toggle_playing(SampleInstance *this)

{
  undefined1 uVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = (*(this->super_Element)._vptr_Element[2])();
  if ((byte)iVar2 == 0) {
    al_set_sample_instance_position(this->splinst,this->pos);
  }
  else {
    uVar3 = al_get_sample_instance_position();
    this->pos = uVar3;
  }
  uVar1 = al_set_sample_instance_playing(this->splinst,(byte)iVar2 ^ 1);
  return (bool)uVar1;
}

Assistant:

bool SampleInstance::toggle_playing()
{
   bool playing = is_playing();
   if (playing)
      pos = al_get_sample_instance_position(splinst);
   else
      al_set_sample_instance_position(splinst, pos);
   return al_set_sample_instance_playing(splinst, !playing);
}